

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# playera.cpp
# Opt level: O3

UINT8 __thiscall PlayerA::Seek(PlayerA *this,UINT8 unit,UINT32 pos)

{
  PlayerBase *pPVar1;
  UINT8 UVar2;
  uint uVar4;
  int iVar3;
  
  pPVar1 = this->_player;
  if (pPVar1 == (PlayerBase *)0x0) {
    UVar2 = 0xff;
  }
  else {
    iVar3 = (*pPVar1->_vptr_PlayerBase[0x22])(pPVar1,(ulong)unit);
    UVar2 = (UINT8)iVar3;
    iVar3 = (*this->_player->_vptr_PlayerBase[0x19])();
    this->_myPlayState = (byte)iVar3 & 3;
    uVar4 = (*this->_player->_vptr_PlayerBase[0x1a])(this->_player,2);
    if (uVar4 < this->_fadeSmplStart) {
      this->_fadeSmplStart = 0xffffffff;
    }
    if (uVar4 < this->_endSilenceStart) {
      this->_endSilenceStart = 0xffffffff;
    }
  }
  return UVar2;
}

Assistant:

UINT8 PlayerA::Seek(UINT8 unit, UINT32 pos)
{
	if (_player == NULL)
		return 0xFF;
	UINT8 retVal = _player->Seek(unit, pos);
	_myPlayState = _player->GetState() & (PLAYSTATE_PLAY | PLAYSTATE_END);
	
	UINT32 pbSmpl = _player->GetCurPos(PLAYPOS_SAMPLE);
	if (pbSmpl < _fadeSmplStart)
		_fadeSmplStart = (UINT32)-1;
	if (pbSmpl < _endSilenceStart)
		_endSilenceStart = (UINT32)-1;
	return retVal;
}